

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestResults.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_37e72::TestNotifiesReporterOfTestStartWithCorrectInfo::
~TestNotifiesReporterOfTestStartWithCorrectInfo
          (TestNotifiesReporterOfTestStartWithCorrectInfo *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(NotifiesReporterOfTestStartWithCorrectInfo)
{
    RecordingReporter reporter;
    TestResults results(&reporter);
    results.OnTestStart(details);

    CHECK_EQUAL (1, reporter.testRunCount);
    CHECK_EQUAL ("suitename", reporter.lastStartedSuite);
    CHECK_EQUAL ("testname", reporter.lastStartedTest);
}